

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O3

int __thiscall Sudoku::doplnK(Sudoku *this,int x,int y,int cislo)

{
  byte bVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  uVar3 = 0;
  if ((uint)y < 9 && (uint)x < 9) {
    uVar6 = y * 9 + x;
    bVar1 = *(byte *)((this->s).pole + uVar6);
    if ((bVar1 & 0x10) == 0) {
      uVar5 = (x & 0xffU) / 3;
      uVar3 = (y & 0xffU) / 3;
      uVar4 = 1 << ((byte)cislo & 0x1f);
      bVar7 = (((this->s).sloupce[(uint)x] | (this->s).radky[(uint)y] |
               (this->s).ctverce[uVar5][uVar3]) >> (cislo & 0x1fU) & 1) == 0;
      if (bVar7) {
        *(byte *)((this->s).pole + uVar6) = bVar1 & 0xe0 | (byte)cislo & 0xf;
        puVar2 = (this->s).radky + (uint)y;
        *puVar2 = *puVar2 | uVar4;
        puVar2 = (this->s).sloupce + (uint)x;
        *puVar2 = *puVar2 | uVar4;
        puVar2 = (this->s).ctverce[uVar5] + uVar3;
        *puVar2 = *puVar2 | uVar4;
        puVar2 = &(this->s).doplnenych;
        *puVar2 = *puVar2 + 1;
      }
      uVar3 = (uint)bVar7;
    }
  }
  return uVar3;
}

Assistant:

int Sudoku::doplnK (int x, int y, int cislo)
{
  if(0 <= x && x < 9)
  {
    if(0 <= y && y < 9)
    {
      if(s.pole[y*9+x].pevne)// pevna cisla nelze prepisovat
        return false;
      unsigned int zakazano = s.radky[y] | s.sloupce[x] | s.ctverce[x/3][y/3];
      if((1 << cislo) & ~zakazano) // pokud nelze doplnit, koncime
      {
        s.pole[y*9+x].zapsane = cislo;
        // zakazeme pouzit cislo v radku, sloupci a ctverci
        s.radky[y] |= (1 << cislo);
        s.sloupce[x] |= (1 << cislo);
        s.ctverce[x/3][y/3] |= (1 << cislo);
        s.doplnenych++;
        return true;
      }
    }
  }
  return false;
}